

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O3

void u_quadrature_rule(int n,double *t,double *w)

{
  double *e;
  ulong uVar1;
  ulong uVar2;
  
  if (n < 1) {
    e = (double *)operator_new__(-(ulong)(n != 0));
    *w = 1.2533141373155001;
    imtqlx(n,t,e,w);
  }
  else {
    uVar1 = (ulong)(uint)n;
    uVar2 = 0;
    memset(t,0,uVar1 * 8);
    e = (double *)operator_new__(uVar1 * 8);
    do {
      e[uVar2] = 0.5;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    *w = 1.2533141373155001;
    if (n != 1) {
      memset(w + 1,0,(ulong)(n - 1) << 3);
    }
    imtqlx(n,t,e,w);
    uVar2 = 0;
    do {
      w[uVar2] = w[uVar2] * w[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  operator_delete__(e);
  return;
}

Assistant:

void u_quadrature_rule ( int n, double t[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    U_QUADRATURE_RULE: quadrature rule for U(n,x).
//
//  Discussion:
//
//    Thanks to Csaba Kertesz for pointing out some temporary memory that needed to be freed,
//    06 November 2015.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 November 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the rule.
//
//    Output, double T[N], W[N], the points and weights of the rule.
//
{
  double *bj;
  int i;
  const double r8_pi = 3.141592653589793;

  for ( i = 0; i < n; i++ )
  {
    t[i] = 0.0;
  }

  bj = new double[n];
  for ( i = 0; i < n; i++ )
  {
    bj[i] = 0.5;
  }

  w[0] = sqrt ( r8_pi / 2.0 );
  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
  imtqlx ( n, t, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }
//
//  Free memory.
//
  delete [] bj;

  return;
}